

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fGeometryShaderTests.cpp
# Opt level: O3

void __thiscall
deqp::gles31::Functional::anon_unknown_1::BuiltinVariableShader::shadeFragments
          (BuiltinVariableShader *this,FragmentPacket *packets,int numPackets,
          FragmentShadingContext *context)

{
  uint uVar1;
  GenericVec4 *pGVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  long lVar5;
  int iVar6;
  ulong uVar7;
  FragmentPacket *packet;
  int fragNdx;
  int iVar8;
  int iVar9;
  Vec4 colors [4];
  deUint32 local_98;
  deUint32 local_94;
  deUint32 local_90;
  deUint32 local_8c;
  ulong local_88;
  FragmentPacket *local_80;
  undefined8 local_78 [9];
  
  local_78[0] = 0x3f8000003f800000;
  local_78[1] = 0x3f80000000000000;
  local_78[2] = 0x3f800000;
  local_78[3] = 0x3f80000000000000;
  local_78[4] = 0x3f80000000000000;
  local_78[5] = 0x3f80000000000000;
  local_78[6] = 0;
  local_78[7] = 0x3f8000003f800000;
  uVar1 = *(uint *)&(this->super_ShaderProgram).field_0x154;
  if (uVar1 < 2) {
    if (0 < numPackets) {
      local_88 = (ulong)(uint)numPackets;
      iVar9 = 0;
      uVar7 = 0;
      local_80 = packets;
      do {
        packet = local_80 + uVar7;
        iVar8 = 0;
        do {
          rr::readVarying<float>((rr *)&local_98,packet,context,0,iVar8);
          pGVar2 = context->outputArray;
          iVar6 = (iVar9 + iVar8) * context->numFragmentOutputs;
          pGVar2[iVar6].v.uData[0] = local_98;
          pGVar2[iVar6].v.uData[1] = local_94;
          pGVar2[iVar6].v.uData[2] = local_90;
          pGVar2[iVar6].v.uData[3] = local_8c;
          iVar8 = iVar8 + 1;
        } while (iVar8 != 4);
        uVar7 = uVar7 + 1;
        iVar9 = iVar9 + 4;
      } while (uVar7 != local_88);
    }
  }
  else if ((uVar1 == 2) && (0 < numPackets)) {
    lVar5 = (long)(context->primitiveID % 4);
    uVar3 = local_78[lVar5 * 2];
    uVar4 = local_78[lVar5 * 2 + 1];
    pGVar2 = context->outputArray;
    iVar9 = context->numFragmentOutputs;
    iVar8 = 0;
    uVar7 = 0;
    do {
      lVar5 = 4;
      iVar6 = iVar8;
      do {
        *(undefined8 *)&pGVar2[iVar6].v = uVar3;
        *(undefined8 *)((long)&pGVar2[iVar6].v + 8) = uVar4;
        iVar6 = iVar6 + iVar9;
        lVar5 = lVar5 + -1;
      } while (lVar5 != 0);
      uVar7 = uVar7 + 1;
      iVar8 = iVar8 + iVar9 * 4;
    } while (uVar7 != (uint)numPackets);
  }
  return;
}

Assistant:

void BuiltinVariableShader::shadeFragments (rr::FragmentPacket* packets, const int numPackets, const rr::FragmentShadingContext& context) const
{
	const tcu::Vec4 red			= tcu::Vec4(1.0f, 0.0f, 0.0f, 1.0f);
	const tcu::Vec4 green		= tcu::Vec4(0.0f, 1.0f, 0.0f, 1.0f);
	const tcu::Vec4 blue		= tcu::Vec4(0.0f, 0.0f, 1.0f, 1.0f);
	const tcu::Vec4 yellow		= tcu::Vec4(1.0f, 1.0f, 0.0f, 1.0f);
	const tcu::Vec4 colors[4]	= { yellow, red, green, blue };

	if (m_test == TEST_POINT_SIZE || m_test == TEST_PRIMITIVE_ID_IN)
	{
		for (int packetNdx = 0; packetNdx < numPackets; ++packetNdx)
		for (int fragNdx = 0; fragNdx < 4; ++fragNdx)
			rr::writeFragmentOutput(context, packetNdx, fragNdx, 0, rr::readVarying<float>(packets[packetNdx], context, 0, fragNdx));
	}
	else if (m_test == TEST_PRIMITIVE_ID)
	{
		const tcu::Vec4 color = colors[context.primitiveID % 4];

		for (int packetNdx = 0; packetNdx < numPackets; ++packetNdx)
		for (int fragNdx = 0; fragNdx < 4; ++fragNdx)
			rr::writeFragmentOutput(context, packetNdx, fragNdx, 0, color);
	}
	else
		DE_ASSERT(DE_FALSE);
}